

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpConnection.c
# Opt level: O3

sbfError sbfTcpConnection_accept
                   (sbfTcpConnection_conflict tc,sbfMwThread_conflict thread,sbfQueue queue,
                   sbfTcpConnectionReadyCb readyCb,sbfTcpConnectionErrorCb errorCb,
                   sbfTcpConnectionReadCb readCb,void *closure)

{
  sbfLog psVar1;
  sbfError __errnum;
  char *pcVar2;
  
  sbfLog_log(tc->mLog,0,"accepting TCP connection %p %s ready",tc,
             (undefined1 *)((long)&tc->mPeer + 2));
  __errnum = sbfTcpConnectionSet(tc,thread,queue,readyCb,errorCb,readCb,closure);
  if (__errnum == 0) {
    bufferevent_enable(tc->mEvent,6);
  }
  else {
    psVar1 = tc->mLog;
    pcVar2 = strerror(__errnum);
    sbfLog_log(psVar1,3,"error accepting TCP connection %p: %s",tc,pcVar2);
  }
  return __errnum;
}

Assistant:

sbfError
sbfTcpConnection_accept (sbfTcpConnection tc,
                         sbfMwThread thread,
                         sbfQueue queue,
                         sbfTcpConnectionReadyCb readyCb,
                         sbfTcpConnectionErrorCb errorCb,
                         sbfTcpConnectionReadCb readCb,
                         void* closure)
{
    sbfError error;

#ifndef WIN32
        sbfLog_debug (tc->mLog,
                      "accepting TCP connection %p %s ready",
                      tc,
                      tc->mPeer.sun.sun_path);
#else
        char     tmp[INET_ADDRSTRLEN];
        inet_ntop (AF_INET, &tc->mPeer.sin.sin_addr, tmp, sizeof tmp);
        sbfLog_debug (tc->mLog,
                      "accepting TCP connection %p from %s:%hu",
                      tc,
                      tmp,
                      ntohs (tc->mPeer.sin.sin_port));
#endif
    
    error = sbfTcpConnectionSet (tc,
                                  thread,
                                  queue,
                                  readyCb,
                                  errorCb,
                                  readCb,
                                  closure);
    if (error == 0)
        bufferevent_enable (tc->mEvent, EV_READ|EV_WRITE);
    else
    {
        sbfLog_err (tc->mLog,
                    "error accepting TCP connection %p: %s",
                    tc,
                    strerror (error));
    }
    return error;
}